

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::internal::DecodeChildIpv6AddressList
                  (Error *__return_storage_ptr__,
                  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                  *aChildIpv6AddressInfoList,ByteArray *aBuf)

{
  ErrorCode EVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  char *pcVar3;
  size_t i;
  long lVar4;
  char *from;
  ushort uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  bool bVar6;
  format_args args;
  ChildIpv6AddrInfo childIpv6AddrsInfo;
  writer write;
  undefined1 local_d8 [8];
  uchar *local_d0;
  uchar local_c0 [16];
  string local_b0;
  ChildIpv6AddrInfo local_90;
  writer local_70;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  parse_func local_40 [1];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.mRloc16 = 0;
  local_90.mChildId = 0;
  local_90.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((int)__last._M_current - (int)puVar2 & 0xfU) == 2) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar5 = (ushort)puVar2[lVar4] | uVar5 << 8;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    local_90._0_4_ = CONCAT22(uVar5,uVar5) & 0x1ffffff;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + 2),__last,(allocator_type *)&local_b0);
    DecodeIpv6AddressList((Error *)local_68,&local_90.mAddrs,(ByteArray *)local_d8);
    __return_storage_ptr__->mCode = local_68._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_60)
    ;
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_p != &local_50) {
      operator_delete(local_60._M_p);
    }
    if ((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
    }
    if (EVar1 == kNone) {
      std::
      vector<ot::commissioner::ChildIpv6AddrInfo,std::allocator<ot::commissioner::ChildIpv6AddrInfo>>
      ::emplace_back<ot::commissioner::ChildIpv6AddrInfo&>
                ((vector<ot::commissioner::ChildIpv6AddrInfo,std::allocator<ot::commissioner::ChildIpv6AddrInfo>>
                  *)aChildIpv6AddressInfoList,&local_90);
    }
  }
  else {
    local_68._0_4_ = none_type;
    from = "premature end of Child IPv6 Address";
    local_60._M_p = "premature end of Child IPv6 Address";
    local_58 = 0x23;
    local_50._M_allocated_capacity = 0;
    local_40[0] = (parse_func)0x0;
    local_70.handler_ = (format_string_checker<char> *)local_68;
    local_50._8_8_ = (format_string_checker<char> *)local_68;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_001a6976:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,from,to);
        from = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_68);
        bVar6 = true;
      }
      else {
        to = from + 1;
        bVar6 = to != "";
        if (bVar6) {
          if (*to != '{') {
            pcVar3 = from + 2;
            do {
              to = pcVar3;
              bVar6 = to != "";
              if (to == "") goto LAB_001a6972;
              pcVar3 = to + 1;
            } while (*to != '{');
          }
          bVar6 = true;
        }
LAB_001a6972:
        if (bVar6) goto LAB_001a6976;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,from,"");
        bVar6 = false;
      }
    } while (bVar6);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"premature end of Child IPv6 Address",(string_view)ZEXT816(0x23),
               args);
    local_d8._0_4_ = kBadFormat;
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    __return_storage_ptr__->mCode = local_d8._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_d0)
    ;
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.mAddrs);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeChildIpv6AddressList(std::vector<ChildIpv6AddrInfo> &aChildIpv6AddressInfoList,
                                           const ByteArray                &aBuf)
{
    Error             error;
    size_t            length = aBuf.size();
    ChildIpv6AddrInfo childIpv6AddrsInfo;

    VerifyOrExit((length % kIpv6AddressBytes) == kRloc16Bytes,
                 error = ERROR_BAD_FORMAT("premature end of Child IPv6 Address"));
    childIpv6AddrsInfo.mRloc16  = utils::Decode<uint16_t>(aBuf.data(), kRloc16Bytes);
    childIpv6AddrsInfo.mChildId = childIpv6AddrsInfo.mRloc16 & 0x1FF;

    SuccessOrExit(error = DecodeIpv6AddressList(childIpv6AddrsInfo.mAddrs, {aBuf.begin() + kRloc16Bytes, aBuf.end()}));
    aChildIpv6AddressInfoList.emplace_back(childIpv6AddrsInfo);

exit:
    return error;
}